

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void evaluate_merging_condition(void)

{
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined8 in_XMM7_Qb;
  int pmerging_flag;
  int N_qp_g;
  int N_qp_p;
  int N_qp_e;
  vector<int,_std::allocator<int>_> N_qp_i;
  char local_51;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  double local_40;
  vector<int,_std::allocator<int>_> local_38;
  double local_20;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38,(long)n_ion_populations,(allocator_type *)&local_50);
  local_50 = 0;
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 200,&local_44,1,
             &ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xcc,&local_48,1,
             &ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xd0,&local_4c,1,
             &ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce(*(undefined8 *)
              ((long)psr._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0xd8),
             local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,n_ion_populations,&ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (mpi_rank == 0) {
    pmerging_now = false;
    local_40 = (crpc * xlength * ylength * zlength) / (dx * dy * dz);
    iVar7 = std::__cxx11::string::compare((char *)&pmerging_abi_cxx11_);
    if (iVar7 == 0) {
      uVar12 = local_48 + local_44 + local_4c;
      if (0 < n_ion_populations) {
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = ZEXT464(uVar12);
        uVar13 = 0;
        auVar18 = vpbroadcastq_avx512f();
        do {
          auVar19 = vpbroadcastq_avx512f();
          auVar20 = vmovdqa64_avx512f(auVar25);
          auVar25 = vporq_avx512f(auVar19,auVar16);
          auVar19 = vporq_avx512f(auVar19,auVar17);
          uVar2 = vpcmpuq_avx512f(auVar19,auVar18,2);
          bVar3 = (byte)uVar2;
          uVar2 = vpcmpuq_avx512f(auVar25,auVar18,2);
          bVar4 = (byte)uVar2;
          uVar14 = CONCAT11(bVar4,bVar3);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       (local_38.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + uVar13));
          auVar19._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar25._4_4_;
          auVar19._0_4_ = (uint)(bVar3 & 1) * auVar25._0_4_;
          auVar19._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar25._8_4_;
          auVar19._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar25._12_4_;
          auVar19._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar25._16_4_;
          auVar19._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar25._20_4_;
          auVar19._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar25._24_4_;
          auVar19._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar25._28_4_;
          auVar19._32_4_ = (uint)(bVar4 & 1) * auVar25._32_4_;
          auVar19._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar25._36_4_;
          auVar19._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar25._40_4_;
          auVar19._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar25._44_4_;
          auVar19._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar25._48_4_;
          auVar19._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar25._52_4_;
          auVar19._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar25._56_4_;
          auVar19._60_4_ = (uint)(bVar4 >> 7) * auVar25._60_4_;
          uVar13 = uVar13 + 0x10;
          auVar25 = vpaddd_avx512f(auVar19,auVar20);
        } while ((n_ion_populations + 0xfU & 0xfffffff0) != uVar13);
        auVar16 = vmovdqa32_avx512f(auVar25);
        auVar17._0_4_ = (uint)(bVar3 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar20._0_4_
        ;
        bVar1 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar17._4_4_ = (uint)bVar1 * auVar16._4_4_ | (uint)!bVar1 * auVar20._4_4_;
        bVar1 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar17._8_4_ = (uint)bVar1 * auVar16._8_4_ | (uint)!bVar1 * auVar20._8_4_;
        bVar1 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar17._12_4_ = (uint)bVar1 * auVar16._12_4_ | (uint)!bVar1 * auVar20._12_4_;
        bVar1 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar17._16_4_ = (uint)bVar1 * auVar16._16_4_ | (uint)!bVar1 * auVar20._16_4_;
        bVar1 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar17._20_4_ = (uint)bVar1 * auVar16._20_4_ | (uint)!bVar1 * auVar20._20_4_;
        bVar1 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar17._24_4_ = (uint)bVar1 * auVar16._24_4_ | (uint)!bVar1 * auVar20._24_4_;
        bVar1 = (bool)((byte)(uVar14 >> 7) & 1);
        auVar17._28_4_ = (uint)bVar1 * auVar16._28_4_ | (uint)!bVar1 * auVar20._28_4_;
        auVar17._32_4_ =
             (uint)(bVar4 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar20._32_4_;
        bVar1 = (bool)(bVar4 >> 1 & 1);
        auVar17._36_4_ = (uint)bVar1 * auVar16._36_4_ | (uint)!bVar1 * auVar20._36_4_;
        bVar1 = (bool)(bVar4 >> 2 & 1);
        auVar17._40_4_ = (uint)bVar1 * auVar16._40_4_ | (uint)!bVar1 * auVar20._40_4_;
        bVar1 = (bool)(bVar4 >> 3 & 1);
        auVar17._44_4_ = (uint)bVar1 * auVar16._44_4_ | (uint)!bVar1 * auVar20._44_4_;
        bVar1 = (bool)(bVar4 >> 4 & 1);
        auVar17._48_4_ = (uint)bVar1 * auVar16._48_4_ | (uint)!bVar1 * auVar20._48_4_;
        bVar1 = (bool)(bVar4 >> 5 & 1);
        auVar17._52_4_ = (uint)bVar1 * auVar16._52_4_ | (uint)!bVar1 * auVar20._52_4_;
        bVar1 = (bool)(bVar4 >> 6 & 1);
        auVar17._56_4_ = (uint)bVar1 * auVar16._56_4_ | (uint)!bVar1 * auVar20._56_4_;
        auVar17._60_4_ =
             (uint)(bVar4 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar20._60_4_;
        auVar15 = vextracti64x4_avx512f(auVar17,1);
        auVar16 = vpaddd_avx512f(auVar17,ZEXT3264(auVar15));
        auVar21 = vpaddd_avx(auVar16._0_16_,auVar16._16_16_);
        auVar23 = vpshufd_avx(auVar21,0xee);
        auVar21 = vpaddd_avx(auVar21,auVar23);
        auVar23 = vpshufd_avx(auVar21,0x55);
        auVar21 = vpaddd_avx(auVar21,auVar23);
        uVar12 = auVar21._0_4_;
      }
      auVar21._0_8_ = (double)(int)uVar12;
      auVar21._8_8_ = in_XMM7_Qb;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_40;
      auVar23._0_8_ = (double)(n_ion_populations + 3);
      auVar23._8_8_ = in_XMM7_Qb;
      if (local_40 * auVar23._0_8_ < auVar21._0_8_) {
        auVar23 = vfnmadd213sd_fma(auVar24,auVar23,auVar21);
        pmerging_now = true;
        *ppd = auVar23._0_8_ / auVar21._0_8_;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\x1b[36m",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ppd = ",6);
        poVar9 = std::ostream::_M_insert<double>(*ppd);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,TERM_NO_COLOR_abi_cxx11_._M_dataplus._M_p,
                   TERM_NO_COLOR_abi_cxx11_._M_string_length);
      }
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)&pmerging_abi_cxx11_);
      iVar7 = n_ion_populations;
      if (iVar8 == 0) {
        dVar22 = (double)local_44;
        bVar1 = true;
        if ((dVar22 <= local_40) && ((double)local_48 <= local_40)) {
          bVar1 = local_40 < (double)local_4c;
        }
        lVar11 = (long)n_ion_populations;
        if (0 < lVar11) {
          lVar10 = 0;
          do {
            bVar5 = !bVar1;
            bVar1 = true;
            if (bVar5) {
              bVar1 = local_40 <
                      (double)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10];
            }
            lVar10 = lVar10 + 1;
          } while (lVar11 != lVar10);
        }
        if (bVar1) {
          pmerging_now = true;
          if (-3 < n_ion_populations) {
            local_20 = dVar22;
            memset(ppd,0,(ulong)(~((int)(n_ion_populations + 2U) >> 0x1f) & n_ion_populations + 2U)
                         * 8 + 8);
            dVar22 = local_20;
          }
          if (local_40 < dVar22) {
            *ppd = (dVar22 - local_40) / dVar22;
          }
          dVar22 = (double)local_48;
          if (local_40 < dVar22) {
            ppd[1] = (dVar22 - local_40) / dVar22;
          }
          dVar22 = (double)local_4c;
          if (local_40 < dVar22) {
            ppd[2] = (dVar22 - local_40) / dVar22;
          }
          pdVar6 = ppd;
          if (0 < iVar7) {
            lVar10 = 0;
            do {
              dVar22 = (double)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar10];
              if (local_40 < dVar22) {
                pdVar6[lVar10 + 3] = (dVar22 - local_40) / dVar22;
              }
              lVar10 = lVar10 + 1;
            } while (lVar11 != lVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\x1b[36m",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ppd =",5);
          if (-3 < n_ion_populations) {
            lVar11 = -1;
            do {
              local_51 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_51,1);
              std::ostream::_M_insert<double>(ppd[lVar11 + 1]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < (long)n_ion_populations + 2);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,TERM_NO_COLOR_abi_cxx11_._M_dataplus._M_p,
                     TERM_NO_COLOR_abi_cxx11_._M_string_length);
        }
      }
    }
    local_50 = (uint)pmerging_now;
  }
  MPI_Bcast(&local_50,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
  MPI_Bcast(ppd,n_ion_populations + 3,&ompi_mpi_double,0,&ompi_mpi_comm_world);
  pmerging_now = local_50 == 1;
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void evaluate_merging_condition()
{
    int N_qp_e, N_qp_p, N_qp_g;
    auto N_qp_i = vector<int>(n_ion_populations);
    int pmerging_flag = 0; // bools are not supported by MPI

    MPI_Reduce(&(psr->N_qp_e), &N_qp_e, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_qp_p), &N_qp_p, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_qp_g), &N_qp_g, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(psr->N_qp_i, &(N_qp_i[0]), n_ion_populations, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);

    if (mpi_rank == 0) {
        double crnp = crpc*xlength*ylength*zlength/(dx*dy*dz);
        pmerging_now = false;
        if (pmerging=="ti") {
            int N_qp;
            N_qp = N_qp_e + N_qp_p + N_qp_g;
            for (int i = 0; i < n_ion_populations; i++)
                N_qp += N_qp_i[i];
            if (N_qp>(3+n_ion_populations)*crnp) {
                pmerging_now = true;
                // portion of particles that will be deleted
                ppd[0] = (N_qp - (3+n_ion_populations)*crnp)/N_qp;
                cout<<"\t\033[36m"<<"ppd = "<<ppd[0]<<TERM_NO_COLOR;
            }
        } else if (pmerging=="nl") {
            bool merge = (N_qp_e>crnp)||(N_qp_p>crnp)||(N_qp_g>crnp);
            for (int i = 0; i < n_ion_populations; ++i)
                merge = merge || (N_qp_i[i]>crnp);
            if (merge) {
                pmerging_now = true;
                // portion of particles that will be deleted
                for (int i=0;i<3+n_ion_populations;i++)
                    ppd[i] = 0;
                if (N_qp_e>crnp)
                    ppd[0] = (N_qp_e - crnp)/N_qp_e;
                if (N_qp_p>crnp)
                    ppd[1] = (N_qp_p - crnp)/N_qp_p;
                if (N_qp_g>crnp)
                    ppd[2] = (N_qp_g - crnp)/N_qp_g;
                for (int i=0;i<n_ion_populations;i++) {
                    if (N_qp_i[i]>crnp)
                        ppd[3+i] = (N_qp_i[i] - crnp)/N_qp_i[i];
                }
                cout<<"\t\033[36m"<<"ppd =";
                for (int i=0;i<3+n_ion_populations;i++) {
                    cout<<' '<<ppd[i];
                }
                cout<<TERM_NO_COLOR;
            }
        }
        pmerging_flag = pmerging_now;
    }
    MPI_Bcast(&pmerging_flag, 1, MPI_INT, 0, MPI_COMM_WORLD);
    MPI_Bcast(ppd, 3+n_ion_populations, MPI_DOUBLE, 0, MPI_COMM_WORLD);

    pmerging_now = (pmerging_flag == 1);
}